

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_long>
 math::wide_integer::detail::gcd_unsafe<unsigned_long>(unsigned_long u,unsigned_long v)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  uVar8 = v;
  if ((u != 0) && (uVar8 = u, v != 0)) {
    uVar4 = u - 1 & ~u;
    iVar2 = 0x40;
    uVar10 = 0x20;
    do {
      uVar5 = uVar4 >> (sbyte)uVar10;
      uVar3 = uVar10;
      if (uVar5 == 0) {
        uVar3 = 0;
        uVar5 = uVar4;
      }
      uVar4 = uVar5;
      iVar2 = iVar2 - uVar3;
      bVar1 = 1 < uVar10;
      uVar10 = uVar10 >> 1;
    } while (bVar1);
    iVar2 = (int)uVar4 - iVar2;
    uVar4 = v - 1 & ~v;
    iVar9 = 0x40;
    uVar10 = 0x20;
    do {
      uVar5 = uVar4 >> (sbyte)uVar10;
      uVar3 = uVar10;
      if (uVar5 == 0) {
        uVar3 = 0;
        uVar5 = uVar4;
      }
      uVar4 = uVar5;
      iVar9 = iVar9 - uVar3;
      bVar1 = 1 < uVar10;
      uVar10 = uVar10 >> 1;
    } while (bVar1);
    uVar10 = iVar2 + 0x40;
    uVar3 = ((int)uVar4 - iVar9) + 0x40;
    if (uVar10 <= uVar3) {
      uVar3 = uVar10;
    }
    uVar4 = v >> ((byte)uVar3 & 0x3f);
    uVar5 = u >> ((byte)iVar2 & 0x3f);
    do {
      uVar6 = uVar4 - 1 & ~uVar4;
      iVar2 = 0;
      uVar10 = 0x20;
      do {
        uVar7 = uVar6 >> (sbyte)uVar10;
        uVar11 = uVar10;
        if (uVar7 == 0) {
          uVar11 = 0;
          uVar7 = uVar6;
        }
        uVar6 = uVar7;
        iVar2 = iVar2 - uVar11;
        bVar1 = 1 < uVar10;
        uVar10 = uVar10 >> 1;
      } while (bVar1);
      uVar6 = uVar4 >> ((char)uVar6 - (char)iVar2 & 0x3fU);
      uVar7 = uVar5 - uVar6;
      uVar4 = uVar7;
      if (uVar6 > uVar5 || uVar7 == 0) {
        uVar4 = -(uVar5 - uVar6);
      }
      if (uVar6 <= uVar5) {
        uVar5 = uVar6;
      }
    } while (uVar7 != 0);
    uVar8 = uVar5 << ((byte)uVar3 & 0x3f);
  }
  return uVar8;
}

Assistant:

constexpr auto gcd_unsafe(UnsignedIntegralType u, UnsignedIntegralType v) -> std::enable_if_t<(   (std::is_integral<UnsignedIntegralType>::value) // NOLINT(altera-id-dependent-backward-branch)
                                                                                                 && (std::is_unsigned<UnsignedIntegralType>::value)), UnsignedIntegralType>
  {
    using local_unsigned_integral_type = UnsignedIntegralType;

    // Handle cases having (u != 0) and (v != 0).
    if(u == static_cast<local_unsigned_integral_type>(UINT8_C(0))) { return v; }

    if(v == static_cast<local_unsigned_integral_type>(UINT8_C(0))) { return u; }

    // Shift the greatest power of 2 dividing both u and v.
    const unsigned trz { static_cast<unsigned>(ctz_unsafe(u)) };

    const unsigned shift_amount { detail::min_unsafe(trz, ctz_unsafe(v)) };

    v >>= shift_amount;
    u >>= trz;

    do
    {
      // Reduce the GCD.

      v >>= ctz_unsafe(v);

      if(u > v)
      {
        swap_unsafe(u, v);
      }

      v -= u;
    }
    while(v != static_cast<local_unsigned_integral_type>(UINT8_C(0))); // NOLINT(altera-id-dependent-backward-branch)

    return static_cast<local_unsigned_integral_type>(u << shift_amount);
  }